

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O2

dgMatrix * __thiscall dgMatrix::Symetric3by3Inverse(dgMatrix *__return_storage_ptr__,dgMatrix *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  dgTemplateVector<float> local_38;
  dgTemplateVector<float> local_28;
  
  fVar1 = (this->m_front).super_dgTemplateVector<float>.m_y;
  fVar2 = (this->m_up).super_dgTemplateVector<float>.m_z;
  fVar3 = (this->m_front).super_dgTemplateVector<float>.m_z;
  fVar4 = (this->m_front).super_dgTemplateVector<float>.m_x;
  fVar5 = (this->m_up).super_dgTemplateVector<float>.m_y;
  fVar6 = (this->m_right).super_dgTemplateVector<float>.m_z;
  fVar7 = (this->m_up).super_dgTemplateVector<float>.m_x;
  fVar8 = (this->m_right).super_dgTemplateVector<float>.m_y;
  fVar9 = fVar1 * fVar2 * fVar3;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 + fVar9)),ZEXT416((uint)fVar6),
                            ZEXT416((uint)(fVar4 * fVar5)));
  auVar10 = vfnmadd213ss_fma(ZEXT416((uint)(fVar5 * fVar3)),ZEXT416((uint)fVar3),auVar10);
  auVar14._8_4_ = 0x80000000;
  auVar14._0_8_ = 0x8000000080000000;
  auVar14._12_4_ = 0x80000000;
  auVar14 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar14);
  auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar4),ZEXT416((uint)fVar6)
                           );
  auVar14 = ZEXT416((uint)(fVar1 * auVar14._0_4_));
  auVar10 = vfmadd231ss_fma(auVar10,auVar14,ZEXT416((uint)fVar6));
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar4),ZEXT416((uint)fVar5));
  auVar10 = vfnmadd213ss_fma(ZEXT416((uint)(fVar4 * fVar2)),ZEXT416((uint)fVar2),auVar10);
  fVar9 = 1.0 / auVar10._0_4_;
  auVar10 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),ZEXT416((uint)fVar5),ZEXT416((uint)fVar6)
                           );
  fVar3 = (this->m_right).super_dgTemplateVector<float>.m_x;
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar7)),ZEXT416((uint)fVar3),ZEXT416((uint)fVar2)
                           );
  auVar13 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * fVar5)),ZEXT416((uint)fVar8),ZEXT416((uint)fVar7)
                           );
  fVar5 = fVar9 * auVar12._0_4_;
  fVar2 = fVar9 * auVar13._0_4_;
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar8 * fVar4)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar3)
                           );
  fVar1 = fVar9 * auVar12._0_4_;
  dgVector::dgVector((dgVector *)&local_28,(HaF32)(fVar9 * auVar10._0_4_),(HaF32)fVar5,(HaF32)fVar2,
                     0.0);
  dgVector::dgVector((dgVector *)&local_38,(HaF32)fVar5,(HaF32)(fVar9 * auVar11._0_4_),(HaF32)fVar1,
                     0.0);
  dgVector::dgVector(&__return_storage_ptr__->m_right,(HaF32)fVar2,(HaF32)fVar1,
                     (HaF32)(fVar9 * auVar14._0_4_),0.0);
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_x = local_28.m_x;
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_y = local_28.m_y;
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_z = local_28.m_z;
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_w = local_28.m_w;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_x = local_38.m_x;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_y = local_38.m_y;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_z = local_38.m_z;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_w = local_38.m_w;
  (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_x = 0.0;
  (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_y = 0.0;
  (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_z = 0.0;
  (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_w = 1.0;
  return __return_storage_ptr__;
}

Assistant:

dgMatrix dgMatrix::Symetric3by3Inverse () const
{
	const dgMatrix& mat = *this;
	hacd::HaF64 det = mat[0][0] * mat[1][1] * mat[2][2] + 
			mat[0][1] * mat[1][2] * mat[0][2] * hacd::HaF32 (2.0f) -
			mat[0][2] * mat[1][1] * mat[0][2] -
			mat[0][1] * mat[0][1] * mat[2][2] -
			mat[0][0] * mat[1][2] * mat[1][2];

	det = hacd::HaF32 (1.0f) / det;

	hacd::HaF32 x11 = (hacd::HaF32)(det * (mat[1][1] * mat[2][2] - mat[1][2] * mat[1][2]));  
	hacd::HaF32 x22 = (hacd::HaF32)(det * (mat[0][0] * mat[2][2] - mat[0][2] * mat[0][2]));  
	hacd::HaF32 x33 = (hacd::HaF32)(det * (mat[0][0] * mat[1][1] - mat[0][1] * mat[0][1]));  

	hacd::HaF32 x12 = (hacd::HaF32)(det * (mat[1][2] * mat[2][0] - mat[1][0] * mat[2][2]));  
	hacd::HaF32 x13 = (hacd::HaF32)(det * (mat[1][0] * mat[2][1] - mat[1][1] * mat[2][0]));  
	hacd::HaF32 x23 = (hacd::HaF32)(det * (mat[0][1] * mat[2][0] - mat[0][0] * mat[2][1]));  


#ifdef _DEBUG
	dgMatrix matInv (dgVector (x11, x12, x13, hacd::HaF32(0.0f)),
				     dgVector (x12, x22, x23, hacd::HaF32(0.0f)),
					 dgVector (x13, x23, x33, hacd::HaF32(0.0f)),
					 dgVector (hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(1.0f)));

	dgMatrix test (matInv * mat);
	HACD_ASSERT (dgAbsf (test[0][0] - hacd::HaF32(1.0f)) < hacd::HaF32(0.01f));
	HACD_ASSERT (dgAbsf (test[1][1] - hacd::HaF32(1.0f)) < hacd::HaF32(0.01f));
	HACD_ASSERT (dgAbsf (test[2][2] - hacd::HaF32(1.0f)) < hacd::HaF32(0.01f));
#endif

	return dgMatrix (dgVector (x11, x12, x13, hacd::HaF32(0.0f)),
					 dgVector (x12, x22, x23, hacd::HaF32(0.0f)),
					 dgVector (x13, x23, x33, hacd::HaF32(0.0f)),
					 dgVector (hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(0.0f), hacd::HaF32(1.0f)));
}